

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryIndexOf(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  Var *values;
  undefined4 *puVar5;
  JavascriptBoolean *pJVar6;
  JavascriptLibrary *pJVar7;
  JavascriptBoolean *pJVar8;
  Var returnValue;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  pTVar4 = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar4,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xfca,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  jsReentLock._24_8_ = RecyclableObject::GetScriptContext(function);
  pTVar4 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_68,pTVar4);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xfce,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  JsReentLock::unlock((JsReentLock *)local_68);
  pJVar6 = (JavascriptBoolean *)
           IndexOfHelper<false>((Arguments *)&scriptContext,(ScriptContext *)jsReentLock._24_8_);
  pJVar7 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  pJVar8 = JavascriptLibraryBase::GetTrue(&pJVar7->super_JavascriptLibraryBase);
  if (pJVar6 != pJVar8) {
    pJVar7 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    pJVar8 = JavascriptLibraryBase::GetFalse(&pJVar7->super_JavascriptLibraryBase);
    if (pJVar6 != pJVar8) goto LAB_010cc5ca;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0xfd5,
                              "(returnValue != scriptContext->GetLibrary()->GetTrue() && returnValue != scriptContext->GetLibrary()->GetFalse())"
                              ,
                              "returnValue != scriptContext->GetLibrary()->GetTrue() && returnValue != scriptContext->GetLibrary()->GetFalse()"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_010cc5ca:
  JsReentLock::~JsReentLock((JsReentLock *)local_68);
  return pJVar6;
}

Assistant:

Var JavascriptArray::EntryIndexOf(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_IndexOf);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Array_Prototype_indexOf);

        JS_REENTRANT_UNLOCK(jsReentLock, Var returnValue =  IndexOfHelper<false>(args, scriptContext));

        //IndexOfHelper code is reused for array.prototype.includes as well. Let us assert here we didn't get a true or false instead of index
        Assert(returnValue != scriptContext->GetLibrary()->GetTrue() && returnValue != scriptContext->GetLibrary()->GetFalse());

        return returnValue;
        JIT_HELPER_END(Array_IndexOf);
    }